

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O1

NLW2_SOLReadResultCode __thiscall
mp::SOLReader2<mp::SOLHandler_Easy>::gsufread(SOLReader2<mp::SOLHandler_Easy> *this,FILE *f)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  byte *pbVar10;
  long lVar11;
  char *pcVar12;
  ulong __n;
  byte *pbVar13;
  byte bVar14;
  NLW2_SOLReadResultCode unaff_R15D;
  SuffixReader<int> sr;
  SuffixInfo si;
  SufRead SR;
  char buf [512];
  char *local_448;
  allocator<char> local_439;
  undefined1 local_438 [16];
  NLW2_SOLReadResultCode local_428;
  undefined4 uStack_424;
  _Alloc_hider local_420;
  size_type local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  uint local_400;
  _Alloc_hider local_3f8;
  size_type local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  _Alloc_hider local_3d8;
  size_type local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  char *local_3b8;
  NLW2_SOLReadResultCode *local_3b0;
  SuffixInfo local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_360;
  size_type local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  char *local_340;
  SuffixInfo local_338;
  SuffixInfo local_2f0;
  SufRead local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined4 local_238;
  undefined3 uStack_234;
  byte local_231 [513];
  
  local_3b0 = &this->readresult_;
  do {
    pcVar8 = fgets((char *)&local_238,0x1ff,(FILE *)f);
    if (pcVar8 == (char *)0x0) {
      return NLW2_SOLRead_OK;
    }
    local_2a8.xp.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2a8.xp.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2a8.xp.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pbVar10 = local_231;
    if (CONCAT31(uStack_234,local_238._3_1_) == 0x20786966 && local_238 == 0x66667573) {
      do {
        pbVar13 = pbVar10;
        bVar14 = *pbVar13;
        pbVar10 = pbVar13 + 1;
      } while (bVar14 == 0x20);
      if ((byte)(bVar14 - 0x3a) < 0xf6) {
        bVar6 = false;
        pbVar10 = local_231;
      }
      else {
        local_2a8.h.kind = (int)(byte)(bVar14 - 0x30);
        bVar14 = *pbVar10;
        if ((byte)(bVar14 - 0x30) < 10) {
          do {
            pbVar10 = pbVar13;
            local_2a8.h.kind = ((uint)bVar14 + local_2a8.h.kind * 10) - 0x30;
            bVar14 = pbVar10[2];
            pbVar13 = pbVar10 + 1;
          } while ((byte)(bVar14 - 0x30) < 10);
          pbVar10 = pbVar10 + 2;
        }
        bVar14 = *pbVar10;
        bVar6 = true;
        if (bVar14 < 0xd) {
          if ((bVar14 != 0) && (bVar14 != 10)) {
LAB_0011afca:
            bVar6 = false;
          }
        }
        else if (bVar14 != 0x20) {
          if ((bVar14 != 0xd) || (pbVar13[2] != 10)) goto LAB_0011afca;
          pbVar10 = pbVar13 + 2;
        }
      }
      pbVar13 = pbVar10;
      if (!bVar6) {
LAB_0011b046:
        local_438._0_8_ = (FILE *)&local_428;
        sVar9 = strlen((char *)&local_238);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,&local_238,(long)&local_238 + sVar9);
        serror(this,"Bad line in \'%s\': %s",this->stub_,local_438._0_8_);
        goto LAB_0011b088;
      }
      do {
        bVar14 = *pbVar13;
        pbVar13 = pbVar13 + 1;
      } while (bVar14 == 0x20);
      if ((byte)(bVar14 - 0x3a) < 0xf6) {
LAB_0011afea:
        bVar6 = false;
      }
      else {
        local_2a8.h.n = (int)(byte)(bVar14 - 0x30);
        bVar14 = *pbVar13;
        pbVar10 = pbVar13;
        while ((byte)(bVar14 - 0x30) < 10) {
          local_2a8.h.n = ((uint)bVar14 + local_2a8.h.n * 10) - 0x30;
          pbVar13 = pbVar10 + 1;
          pbVar10 = pbVar10 + 1;
          bVar14 = *pbVar13;
        }
        bVar14 = *pbVar10;
        bVar6 = true;
        if (bVar14 < 0xd) {
          if ((bVar14 != 0) && (bVar14 != 10)) goto LAB_0011afea;
        }
        else if (bVar14 != 0x20) {
          if ((bVar14 != 0xd) || (pbVar10[1] != 10)) goto LAB_0011afea;
          pbVar10 = pbVar10 + 1;
        }
      }
      pbVar13 = pbVar10;
      if (!bVar6) goto LAB_0011b046;
      do {
        bVar14 = *pbVar13;
        pbVar13 = pbVar13 + 1;
      } while (bVar14 == 0x20);
      if ((byte)(bVar14 - 0x3a) < 0xf6) {
LAB_0011b00a:
        bVar6 = false;
      }
      else {
        local_2a8.h.namelen = (int)(byte)(bVar14 - 0x30);
        bVar14 = *pbVar13;
        pbVar10 = pbVar13;
        while ((byte)(bVar14 - 0x30) < 10) {
          local_2a8.h.namelen = ((uint)bVar14 + local_2a8.h.namelen * 10) - 0x30;
          pbVar13 = pbVar10 + 1;
          pbVar10 = pbVar10 + 1;
          bVar14 = *pbVar13;
        }
        bVar14 = *pbVar10;
        bVar6 = true;
        if (bVar14 < 0xd) {
          if ((bVar14 != 0) && (bVar14 != 10)) goto LAB_0011b00a;
        }
        else if (bVar14 != 0x20) {
          if ((bVar14 != 0xd) || (pbVar10[1] != 10)) goto LAB_0011b00a;
          pbVar10 = pbVar10 + 1;
        }
      }
      pbVar13 = pbVar10;
      if (!bVar6) goto LAB_0011b046;
      do {
        bVar14 = *pbVar13;
        pbVar13 = pbVar13 + 1;
      } while (bVar14 == 0x20);
      if ((byte)(bVar14 - 0x3a) < 0xf6) {
LAB_0011b02a:
        bVar6 = false;
      }
      else {
        local_2a8.h.tablen = (int)(byte)(bVar14 - 0x30);
        bVar14 = *pbVar13;
        pbVar10 = pbVar13;
        while ((byte)(bVar14 - 0x30) < 10) {
          local_2a8.h.tablen = ((uint)bVar14 + local_2a8.h.tablen * 10) - 0x30;
          pbVar13 = pbVar10 + 1;
          pbVar10 = pbVar10 + 1;
          bVar14 = *pbVar13;
        }
        bVar14 = *pbVar10;
        bVar6 = true;
        if (bVar14 < 0xd) {
          if ((bVar14 != 0) && (bVar14 != 10)) goto LAB_0011b02a;
        }
        else if (bVar14 != 0x20) {
          if ((bVar14 != 0xd) || (pbVar10[1] != 10)) goto LAB_0011b02a;
          pbVar10 = pbVar10 + 1;
        }
      }
      if (!bVar6) goto LAB_0011b046;
      do {
        bVar14 = *pbVar10;
        pbVar10 = pbVar10 + 1;
      } while (bVar14 == 0x20);
      if ((byte)(bVar14 - 0x3a) < 0xf6) goto LAB_0011b046;
      local_2a8.tablines = (int)(byte)(bVar14 - 0x30);
      bVar14 = *pbVar10;
      while ((byte)(bVar14 - 0x30) < 10) {
        local_2a8.tablines = ((uint)bVar14 + local_2a8.tablines * 10) - 0x30;
        pbVar13 = pbVar10 + 1;
        pbVar10 = pbVar10 + 1;
        bVar14 = *pbVar13;
      }
      bVar14 = *pbVar10;
      if (bVar14 < 0xd) {
        if (bVar14 != 0) {
joined_r0x0011b2d0:
          if (bVar14 != 10) goto LAB_0011b046;
        }
      }
      else if (bVar14 != 0x20) {
        if (bVar14 == 0xd) {
          bVar14 = pbVar10[1];
          goto joined_r0x0011b2d0;
        }
        goto LAB_0011b046;
      }
      iVar7 = sufheadcheck(this,&local_2a8);
      if (iVar7 != 0) {
        local_438._0_8_ = (FILE *)&local_428;
        sVar9 = strlen((char *)&local_238);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,&local_238,(long)&local_238 + sVar9);
        serror(this,"Bad line in \'%s\': %s",this->stub_,local_438._0_8_);
        goto LAB_0011b088;
      }
      pcVar8 = fgets((char *)&local_238,0x1ff,(FILE *)f);
      if (pcVar8 == (char *)0x0) {
LAB_0011b440:
        local_438._0_8_ = (FILE *)&local_428;
        sVar9 = strlen((char *)&local_238);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,&local_238,(long)&local_238 + sVar9);
        serror(this,"Bad line in \'%s\': %s",this->stub_,local_438._0_8_);
        goto LAB_0011b088;
      }
      lVar11 = (long)local_2a8.h.namelen;
      cVar5 = *(char *)((long)&local_238 + lVar11 + -1);
      if ((cVar5 != '\n') && ((cVar5 != '\r' || (*(char *)((long)&local_238 + lVar11) != '\n'))))
      goto LAB_0011b440;
      local_248._M_local_buf[lVar11 + 0xf] = '\0';
      strcpy(local_2a8.name,(char *)&local_238);
      pcVar8 = local_2a8.table;
      if ((long)local_2a8.h.tablen != 0) {
        local_340 = local_2a8.table + local_2a8.h.tablen;
        local_3b8 = (char *)CONCAT71(local_3b8._1_7_,1 < local_2a8.tablines);
        if (local_2a8.tablines < 2) {
          local_448 = local_2a8.table;
        }
        else {
          pcVar12 = fgets(local_2a8.table,local_2a8.h.tablen,(FILE *)f);
          if (pcVar12 != (char *)0x0) {
            local_448._0_4_ = 1;
            do {
              local_3b8 = pcVar8;
              sVar9 = strlen(pcVar8);
              pcVar8 = local_3b8 + sVar9;
              iVar7 = (int)local_448 + 1;
              local_3b8 = (char *)CONCAT71(local_3b8._1_7_,iVar7 < local_2a8.tablines);
              local_448 = pcVar8;
              if (local_2a8.tablines <= iVar7) goto LAB_0011b496;
              pcVar12 = fgets(pcVar8,(int)local_340 - (int)pcVar8,(FILE *)f);
              local_448._0_4_ = iVar7;
            } while (pcVar12 != (char *)0x0);
          }
          unaff_R15D = ReportEarlyEof(this);
          local_448 = pcVar8;
        }
LAB_0011b496:
        if ((char)local_3b8 == '\0') {
          pcVar8 = fgets((char *)&local_238,0x1ff,(FILE *)f);
          if (pcVar8 != (char *)0x0) {
            sVar9 = strlen((char *)&local_238);
            if (((sVar9 == 0) || (local_248._M_local_buf[sVar9 + 0xf] != '\n')) ||
               (__n = sVar9 - 1, (ulong)((long)local_340 - (long)local_448) <= __n)) {
              local_438._0_8_ = (FILE *)&local_428;
              sVar9 = strlen((char *)&local_238);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_438,&local_238,(long)&local_238 + sVar9);
              serror(this,"Bad line in \'%s\': %s",this->stub_,local_438._0_8_);
              goto LAB_0011b088;
            }
            if ((__n != 0) &&
               ((local_248._M_local_buf[sVar9 + 0xe] != '\r' || (__n = sVar9 - 2, __n != 0)))) {
              *(undefined1 *)((long)&local_238 + __n) = 0;
              memcpy(local_448,&local_238,__n);
            }
            goto LAB_0011b521;
          }
          unaff_R15D = ReportEarlyEof(this);
        }
        goto LAB_0011b0b0;
      }
LAB_0011b521:
      iVar7 = local_2a8.h.kind;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_360,local_2a8.name,(allocator<char> *)local_438);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,local_2a8.table,&local_439);
      local_3d0 = local_250;
      local_3f0 = local_358;
      paVar1 = &local_3a8.name_.field_2;
      local_3a8.table_._M_dataplus._M_p = (pointer)&local_3a8.table_.field_2;
      if (local_360 == &local_350) {
        local_3a8.name_.field_2._8_8_ = local_350._8_8_;
        local_3a8.name_._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_3a8.name_._M_dataplus._M_p = (pointer)local_360;
      }
      local_3a8.name_.field_2._M_allocated_capacity._1_7_ = local_350._M_allocated_capacity._1_7_;
      local_3a8.name_.field_2._M_local_buf[0] = local_350._M_local_buf[0];
      local_3e8._M_allocated_capacity = local_3a8.name_.field_2._M_allocated_capacity;
      if (local_258 == &local_248) {
        local_3a8.table_.field_2._8_8_ = local_248._8_8_;
      }
      else {
        local_3a8.table_._M_dataplus._M_p = (pointer)local_258;
      }
      local_3a8.table_.field_2._M_allocated_capacity._1_7_ = local_248._M_allocated_capacity._1_7_;
      local_3a8.table_.field_2._M_local_buf[0] = local_248._M_local_buf[0];
      local_3c8._M_allocated_capacity = local_3a8.table_.field_2._M_allocated_capacity;
      local_248._M_local_buf[0] = '\0';
      local_250 = 0;
      local_350._M_local_buf[0] = '\0';
      local_358 = 0;
      local_3a8.kind_ = iVar7;
      local_438._0_8_ = f;
      local_360 = &local_350;
      local_258 = &local_248;
      if ((local_2a8.h.kind & 4U) == 0) {
        local_338.kind_ = iVar7;
        local_338.name_._M_dataplus._M_p = (pointer)&local_338.name_.field_2;
        paVar2 = &local_3a8.table_.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8.name_._M_dataplus._M_p == paVar1) {
          local_338.name_.field_2._8_8_ = local_3a8.name_.field_2._8_8_;
        }
        else {
          local_338.name_._M_dataplus._M_p = local_3a8.name_._M_dataplus._M_p;
        }
        local_3a8.name_._M_string_length = 0;
        local_3a8.name_.field_2._M_allocated_capacity =
             (ulong)(uint7)local_350._M_allocated_capacity._1_7_ << 8;
        local_338.table_._M_dataplus._M_p = (pointer)&local_338.table_.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8.table_._M_dataplus._M_p == paVar2) {
          local_338.table_.field_2._8_8_ = local_3a8.table_.field_2._8_8_;
        }
        else {
          local_338.table_._M_dataplus._M_p = local_3a8.table_._M_dataplus._M_p;
        }
        local_3f8._M_p = (pointer)&local_3e8;
        local_3d8._M_p = (pointer)&local_3c8;
        paVar3 = &local_338.name_.field_2;
        local_3a8.table_._M_string_length = 0;
        local_3a8.table_.field_2._M_allocated_capacity =
             (ulong)(uint7)local_248._M_allocated_capacity._1_7_ << 8;
        local_438._8_4_ = this->binary;
        local_438._12_4_ = local_2a8.h.n;
        local_428 = NLW2_SOLRead_OK;
        local_420._M_p = (pointer)&local_410;
        local_418 = 0;
        local_410._M_local_buf[0] = '\0';
        local_400 = iVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338.name_._M_dataplus._M_p == paVar3) {
          local_3e8._8_8_ = local_338.name_.field_2._8_8_;
        }
        else {
          local_3f8._M_p = local_338.name_._M_dataplus._M_p;
        }
        paVar4 = &local_338.table_.field_2;
        local_338.name_._M_string_length = 0;
        local_338.name_.field_2._M_allocated_capacity =
             (ulong)(uint7)local_350._M_allocated_capacity._1_7_ << 8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338.table_._M_dataplus._M_p == paVar4) {
          local_3c8._8_8_ = local_338.table_.field_2._8_8_;
        }
        else {
          local_3d8._M_p = local_338.table_._M_dataplus._M_p;
        }
        local_338.table_._M_string_length = 0;
        local_338.table_.field_2._M_allocated_capacity =
             (ulong)(uint7)local_248._M_allocated_capacity._1_7_ << 8;
        local_3a8.name_._M_dataplus._M_p = (pointer)paVar1;
        local_3a8.table_._M_dataplus._M_p = (pointer)paVar2;
        local_338.name_._M_dataplus._M_p = (pointer)paVar3;
        local_338.table_._M_dataplus._M_p = (pointer)paVar4;
        SuffixInfo::~SuffixInfo(&local_338);
        SOLHandler_Easy::OnSuffix<mp::SuffixReader<int>>(this->solh_,(SuffixReader<int> *)local_438)
        ;
        bVar6 = CheckReader<mp::SuffixReader<int>>(this,(SuffixReader<int> *)local_438,local_3b0);
        if (!bVar6) {
          unaff_R15D = *local_3b0;
        }
        SuffixReader<int>::~SuffixReader((SuffixReader<int> *)local_438);
      }
      else {
        local_2f0.kind_ = iVar7;
        local_2f0.name_._M_dataplus._M_p = (pointer)&local_2f0.name_.field_2;
        paVar2 = &local_3a8.table_.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8.name_._M_dataplus._M_p == paVar1) {
          local_2f0.name_.field_2._8_8_ = local_3a8.name_.field_2._8_8_;
        }
        else {
          local_2f0.name_._M_dataplus._M_p = local_3a8.name_._M_dataplus._M_p;
        }
        local_3a8.name_._M_string_length = 0;
        local_3a8.name_.field_2._M_allocated_capacity =
             (ulong)(uint7)local_350._M_allocated_capacity._1_7_ << 8;
        local_2f0.table_._M_dataplus._M_p = (pointer)&local_2f0.table_.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8.table_._M_dataplus._M_p == paVar2) {
          local_2f0.table_.field_2._8_8_ = local_3a8.table_.field_2._8_8_;
        }
        else {
          local_2f0.table_._M_dataplus._M_p = local_3a8.table_._M_dataplus._M_p;
        }
        paVar3 = &local_2f0.name_.field_2;
        local_3f8._M_p = (pointer)&local_3e8;
        local_3d8._M_p = (pointer)&local_3c8;
        local_3a8.table_._M_string_length = 0;
        local_3a8.table_.field_2._M_allocated_capacity =
             (ulong)(uint7)local_248._M_allocated_capacity._1_7_ << 8;
        local_438._8_4_ = this->binary;
        local_438._12_4_ = local_2a8.h.n;
        local_428 = NLW2_SOLRead_OK;
        local_420._M_p = (pointer)&local_410;
        local_418 = 0;
        local_410._M_local_buf[0] = '\0';
        local_400 = iVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0.name_._M_dataplus._M_p == paVar3) {
          local_3e8._8_8_ = local_2f0.name_.field_2._8_8_;
        }
        else {
          local_3f8._M_p = local_2f0.name_._M_dataplus._M_p;
        }
        paVar4 = &local_2f0.table_.field_2;
        local_2f0.name_._M_string_length = 0;
        local_2f0.name_.field_2._M_allocated_capacity =
             (ulong)(uint7)local_350._M_allocated_capacity._1_7_ << 8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0.table_._M_dataplus._M_p == paVar4) {
          local_3c8._8_8_ = local_2f0.table_.field_2._8_8_;
        }
        else {
          local_3d8._M_p = local_2f0.table_._M_dataplus._M_p;
        }
        local_2f0.table_._M_string_length = 0;
        local_2f0.table_.field_2._M_allocated_capacity =
             (ulong)(uint7)local_248._M_allocated_capacity._1_7_ << 8;
        local_3a8.name_._M_dataplus._M_p = (pointer)paVar1;
        local_3a8.table_._M_dataplus._M_p = (pointer)paVar2;
        local_2f0.name_._M_dataplus._M_p = (pointer)paVar3;
        local_2f0.table_._M_dataplus._M_p = (pointer)paVar4;
        SuffixInfo::~SuffixInfo(&local_2f0);
        SOLHandler_Easy::OnSuffix<mp::SuffixReader<double>>
                  (this->solh_,(SuffixReader<double> *)local_438);
        bVar6 = CheckReader<mp::SuffixReader<double>>
                          (this,(SuffixReader<double> *)local_438,local_3b0);
        if (!bVar6) {
          unaff_R15D = *local_3b0;
        }
        SuffixReader<double>::~SuffixReader((SuffixReader<double> *)local_438);
      }
      bVar6 = bVar6 != false;
      SuffixInfo::~SuffixInfo(&local_3a8);
    }
    else {
      local_438._0_8_ = (FILE *)&local_428;
      sVar9 = strlen((char *)&local_238);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,&local_238,(long)&local_238 + sVar9);
      serror(this,"Bad line in \'%s\': %s",this->stub_,local_438._0_8_);
LAB_0011b088:
      this->readresult_ = NLW2_SOLRead_Bad_Line;
      if ((FILE *)local_438._0_8_ != (FILE *)&local_428) {
        operator_delete((void *)local_438._0_8_,CONCAT44(uStack_424,local_428) + 1);
      }
      unaff_R15D = NLW2_SOLRead_Bad_Line;
LAB_0011b0b0:
      bVar6 = false;
    }
    if (local_2a8.xp.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_2a8.xp.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2a8.xp.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a8.xp.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (!bVar6) {
      return unaff_R15D;
    }
  } while( true );
}

Assistant:

NLW2_SOLReadResultCode SOLReader2<SOLHandler>::gsufread(FILE* f) {
  char *s, *se;
  size_t L;
  char buf[512];

  while(fgets(buf, sizeof(buf)-1, f)) {
    SufRead SR;
    if (strncmp(buf, "suffix ", 7))
      return ReportBadLine(buf);
    s = buf + 7;
    if (Lget(&s, &SR.h.kind)
        || Lget(&s, &SR.h.n)
        || Lget(&s, &SR.h.namelen)
        || Lget(&s, &SR.h.tablen)
        || Lget(&s, &SR.tablines))
      return ReportBadLine(buf);
    if (sufheadcheck(&SR))
      return ReportBadLine(buf);
    if (!fgets(buf, sizeof(buf)-1, f)
        || (buf[SR.h.namelen-1] != '\n'
            && (buf[SR.h.namelen-1] != '\r'
                || buf[SR.h.namelen] != '\n')))
      return ReportBadLine(buf);
    buf[SR.h.namelen-1] = 0;
    strcpy(SR.name, buf);
    if (SR.h.tablen) {
      s = SR.table;
      se = s + SR.h.tablen;
      for(int i = 1; i < SR.tablines; i++) {
        if (!fgets(s, se-s, f))
          return ReportEarlyEof();
        s += strlen(s);
      }
      if (!fgets(buf, sizeof(buf)-1, f))
        return ReportEarlyEof();
      if (!(L = strlen(buf)) || buf[--L] != '\n'
          || L >= (size_t)(se - s))
        return ReportBadLine(buf);
      if (L) {
        if (buf[L-1] != '\r' || --L) {
          buf[L] = 0;
          memcpy(s, buf, L);
        }
      }
    }
    SuffixInfo si(SR.h.kind, SR.name, SR.table);
    if (SR.h.kind & 4) {        // real-valued
      SuffixReader<double> sr(std::move(si), f, binary, SR.h.n);
      Handler().OnDblSuffix(sr);
      if (!CheckReader( sr, readresult_ ))
        return readresult_;
    } else {                    // int-valued
      SuffixReader<int> sr(std::move(si), f, binary, SR.h.n);
      Handler().OnIntSuffix(sr);
      if (!CheckReader( sr, readresult_ ))
        return readresult_;
    }
    //		sufput(&SR, ac, newsufs);
  }
  return NLW2_SOLRead_OK;
}